

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BayesianGameWithClusterInfo.cpp
# Opt level: O2

void __thiscall
BayesianGameWithClusterInfo::~BayesianGameWithClusterInfo(BayesianGameWithClusterInfo *this)

{
  pointer ppvVar1;
  _Vector_base<TypeCluster_*,_std::allocator<TypeCluster_*>_> *this_00;
  pointer ppTVar2;
  TypeCluster *this_01;
  pointer ppvVar3;
  pointer ppTVar4;
  
  (this->super_BayesianGameForDecPOMDPStage).super_BayesianGameForDecPOMDPStageInterface.
  _vptr_BayesianGameForDecPOMDPStageInterface =
       (_func_int **)&PTR__BayesianGameWithClusterInfo_005d85e8;
  (this->super_BayesianGameForDecPOMDPStage).super_BayesianGameIdenticalPayoff.
  super_BayesianGameIdenticalPayoffInterface.super_BayesianGameBase.
  super_Interface_ProblemToPolicyDiscretePure.super_Interface_ProblemToPolicyDiscrete.
  _vptr_Interface_ProblemToPolicyDiscrete = (_func_int **)&PTR__BayesianGameWithClusterInfo_005d8638
  ;
  ppvVar1 = (this->_m_typeLists).
            super__Vector_base<std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_*,_std::allocator<std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  for (ppvVar3 = (this->_m_typeLists).
                 super__Vector_base<std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_*,_std::allocator<std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_*>_>
                 ._M_impl.super__Vector_impl_data._M_start; ppvVar3 != ppvVar1;
      ppvVar3 = ppvVar3 + 1) {
    this_00 = &(*ppvVar3)->super__Vector_base<TypeCluster_*,_std::allocator<TypeCluster_*>_>;
    ppTVar2 = (this_00->_M_impl).super__Vector_impl_data._M_finish;
    for (ppTVar4 = (this_00->_M_impl).super__Vector_impl_data._M_start; ppTVar4 != ppTVar2;
        ppTVar4 = ppTVar4 + 1) {
      this_01 = *ppTVar4;
      if (this_01 != (TypeCluster *)0x0) {
        TypeCluster::~TypeCluster(this_01);
      }
      operator_delete(this_01,0x38);
    }
    std::_Vector_base<TypeCluster_*,_std::allocator<TypeCluster_*>_>::~_Vector_base(this_00);
    operator_delete(this_00,0x18);
  }
  std::
  _Vector_base<std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_*,_std::allocator<std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_*>_>
  ::~_Vector_base(&(this->_m_typeLists).
                   super__Vector_base<std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_*,_std::allocator<std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_*>_>
                 );
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            (&(this->_m_jaohReps).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
  boost::detail::shared_count::~shared_count(&(this->_m_pBGJPol).pn);
  boost::detail::shared_count::~shared_count(&(this->_m_pBG).pn);
  BayesianGameForDecPOMDPStage::~BayesianGameForDecPOMDPStage
            (&this->super_BayesianGameForDecPOMDPStage);
  return;
}

Assistant:

BayesianGameWithClusterInfo::~BayesianGameWithClusterInfo()
{
    //free all the type information:
    std::vector< TypeClusterList* >::iterator it1 =  _m_typeLists.begin();
    std::vector< TypeClusterList* >::iterator last1 =  _m_typeLists.end();
    while(it1 != last1)
    {
        TypeClusterList* aohl = *it1;
        //TypeClusterList defined as std::vector<TypeCluster* > 
         std::vector<TypeCluster* >::iterator it2 = aohl->begin();
         std::vector<TypeCluster* >::iterator last2 = aohl->end();
         while(it2 != last2)
         {
             delete *it2;
             it2++;
         }            
        delete aohl;
        it1++;
    }
}